

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::appendWithSep
          (LocaleDisplayNamesImpl *this,UnicodeString *buffer,UnicodeString *src)

{
  UErrorCode status;
  UnicodeString *values [2];
  UErrorCode local_1c;
  UnicodeString *local_18;
  UnicodeString *local_10;
  
  if ((ushort)(buffer->fUnion).fStackFields.fLengthAndFlags < 0x20) {
    UnicodeString::copyFrom(buffer,src,'\0');
  }
  else {
    local_1c = U_ZERO_ERROR;
    local_18 = buffer;
    local_10 = src;
    SimpleFormatter::formatAndReplace
              (&this->separatorFormat,&local_18,2,buffer,(int32_t *)0x0,0,&local_1c);
  }
  return buffer;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::appendWithSep(UnicodeString& buffer, const UnicodeString& src) const {
    if (buffer.isEmpty()) {
        buffer.setTo(src);
    } else {
        const UnicodeString *values[2] = { &buffer, &src };
        UErrorCode status = U_ZERO_ERROR;
        separatorFormat.formatAndReplace(values, 2, buffer, NULL, 0, status);
    }
    return buffer;
}